

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void __thiscall google::protobuf::FatalException::~FatalException(FatalException *this)

{
  FatalException *this_local;
  
  *(undefined ***)this = &PTR__FatalException_00577bd0;
  std::__cxx11::string::~string((string *)&this->field_0x18);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

FatalException::~FatalException() throw() {}